

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O2

void __thiscall csm::Version::Version(Version *this,int major,int minor,int revision)

{
  Error *pEVar1;
  allocator<char> local_72;
  allocator<char> local_71;
  ErrorType local_70;
  int revision_local;
  int minor_local;
  int major_local;
  string local_60;
  string local_40;
  
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->theVersions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  revision_local = revision;
  minor_local = minor;
  major_local = major;
  if (major < 0) {
    pEVar1 = (Error *)__cxa_allocate_exception(0x50);
    local_70 = BOUNDS;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid major version number",&local_71);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"csm::Version::Version",&local_72);
    Error::Error(pEVar1,&local_70,&local_40,&local_60);
    __cxa_throw(pEVar1,&Error::typeinfo,Error::~Error);
  }
  if (-1 < minor) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&major_local);
    std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&minor_local);
    if (-1 < revision) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&revision_local);
    }
    return;
  }
  pEVar1 = (Error *)__cxa_allocate_exception(0x50);
  local_70 = BOUNDS;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Invalid minor version number",&local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"csm::Version::Version",&local_72);
  Error::Error(pEVar1,&local_70,&local_40,&local_60);
  __cxa_throw(pEVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

Version::Version(int major, int minor, int revision)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   if (major < 0)
   {
      throw Error(Error::BOUNDS, "Invalid major version number", MODULE);
   }
   if (minor < 0)
   {
      throw Error(Error::BOUNDS, "Invalid minor version number", MODULE);
   }

   theVersions.push_back(major);
   theVersions.push_back(minor);
   if (revision >= 0) theVersions.push_back(revision);
}